

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgemm.hpp
# Opt level: O1

void remora::bindings::ugemm<remora::bindings::gemm_block_size<float>,float,float>
               (size_t kc,float alpha,float *A,float *B,float *C,size_t stride1,size_t stride2)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  size_t sVar10;
  undefined1 *puVar11;
  undefined1 *puVar12;
  undefined1 *puVar13;
  long lVar14;
  float *pfVar15;
  long lVar16;
  type Pa;
  undefined1 auStack_1c0 [40];
  size_t local_198;
  float local_190;
  undefined1 local_180 [336];
  
  puVar11 = auStack_1c0;
  puVar12 = auStack_1c0;
  local_198 = stride1;
  local_190 = alpha;
  memset(local_180,0,0x100);
  if (kc != 0) {
    sVar10 = 0;
    do {
      lVar14 = 0;
      puVar13 = local_180;
      do {
        fVar3 = A[lVar14];
        lVar16 = 0;
        do {
          pfVar15 = B + lVar16;
          fVar4 = pfVar15[1];
          fVar5 = pfVar15[2];
          fVar6 = pfVar15[3];
          pfVar1 = (float *)(puVar13 + lVar16 * 4);
          fVar7 = pfVar1[1];
          fVar8 = pfVar1[2];
          fVar9 = pfVar1[3];
          pfVar2 = (float *)(puVar13 + lVar16 * 4);
          *pfVar2 = *pfVar15 * fVar3 + *pfVar1;
          pfVar2[1] = fVar4 * fVar3 + fVar7;
          pfVar2[2] = fVar5 * fVar3 + fVar8;
          pfVar2[3] = fVar6 * fVar3 + fVar9;
          lVar16 = lVar16 + 4;
        } while (lVar16 != 0x10);
        lVar14 = lVar14 + 1;
        puVar13 = puVar13 + 0x40;
      } while (lVar14 != 4);
      A = A + 4;
      B = B + 0x10;
      sVar10 = sVar10 + 1;
    } while (sVar10 != kc);
  }
  if ((local_190 != 1.0) || (NAN(local_190))) {
    lVar14 = 0;
    do {
      puVar11 = puVar11 + 0x40;
      lVar16 = 0;
      do {
        pfVar15 = (float *)(puVar11 + lVar16 * 4);
        fVar3 = pfVar15[1];
        fVar4 = pfVar15[2];
        fVar5 = pfVar15[3];
        pfVar1 = (float *)(puVar11 + lVar16 * 4);
        *pfVar1 = *pfVar15 * local_190;
        pfVar1[1] = fVar3 * local_190;
        pfVar1[2] = fVar4 * local_190;
        pfVar1[3] = fVar5 * local_190;
        lVar16 = lVar16 + 4;
      } while (lVar16 != 0x10);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
  }
  lVar14 = 0;
  do {
    puVar12 = puVar12 + 0x40;
    lVar16 = 0;
    pfVar15 = C;
    do {
      *pfVar15 = *(float *)(puVar12 + lVar16 * 4) + *pfVar15;
      lVar16 = lVar16 + 1;
      pfVar15 = pfVar15 + stride2;
    } while (lVar16 != 0x10);
    lVar14 = lVar14 + 1;
    C = C + local_198;
  } while (lVar14 != 4);
  return;
}

Assistant:

void ugemm(
	std::size_t kc, TC alpha, T const* A, T const* B,
	TC* C, std::size_t stride1, std::size_t stride2
){
	BOOST_ALIGN_ASSUME_ALIGNED(A, block_size::block::align);
	BOOST_ALIGN_ASSUME_ALIGNED(B, block_size::block::align);

	typedef typename block_size::block::type vx;
	static const std::size_t vector_length = block_size::block::vector_elements;
	static const std::size_t vecNR = block_size::nr/vector_length;
#ifdef REMORA_USE_SIMD
	vx P[block_size::mr * vecNR] = {};
#else
	typename std::aligned_storage<sizeof(vx[block_size::mr*vecNR]),block_size::block::align>::type Pa;
	T* P = reinterpret_cast<T*>(&Pa);
	for (std::size_t c = 0; c < block_size::mr*vecNR; c++)
		P[c] = 0;
#endif


	// perform the matrix-matrix product as outer product
	// of rows of A and B
	vx const* b = (vx const*)B;
	for (std::size_t l=0; l<kc; ++l) {
		for (std::size_t i=0; i<block_size::mr; ++i) {
			for (std::size_t j=0; j<vecNR; ++j) {
				P[i * vecNR+j] += A[i]*b[j];
			}
		}
		A += block_size::mr;
		b += vecNR;
	}
	//multiply with alpha if necessary
	if (alpha!=TC(1)) {
		for (std::size_t i=0; i<block_size::mr; ++i) {
			for (std::size_t j=0; j< vecNR; ++j) {
				P[i*vecNR+j] *= alpha;
			}
		}
	}

	//add result to C
	T const* p = (T const*) P;
	for (std::size_t i=0; i<block_size::mr; ++i) {
		for (std::size_t j=0; j<block_size::nr; ++j) {
			C[i * stride1+j * stride2] += p[i*block_size::nr+j];
		}
	}
}